

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gears.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLFWwindow *ctx;
  int local_28;
  int local_24;
  int height;
  int width;
  GLFWwindow *window;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  window = (GLFWwindow *)argv;
  argv_local._0_4_ = argc;
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    fprintf(_stderr,"Failed to initialize GLFW\n");
    exit(1);
  }
  glfwWindowHint(0x21005,0x10);
  _height = glfwCreateWindow(300,300,"Gears",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (_height == (GLFWwindow *)0x0) {
    fprintf(_stderr,"Failed to open GLFW window\n");
    glfwTerminate();
    exit(1);
  }
  glfwSetFramebufferSizeCallback(_height,reshape);
  glfwSetKeyCallback(_height,key);
  glfwMakeContextCurrent(_height);
  gladLoadGLLoader(glfwGetProcAddress);
  glfwSwapInterval(1);
  glfwGetFramebufferSize(_height,&local_24,&local_28);
  ctx = _height;
  reshape(_height,local_24,local_28);
  init((EVP_PKEY_CTX *)ctx);
  while( true ) {
    iVar1 = glfwWindowShouldClose(_height);
    if (iVar1 != 0) break;
    draw();
    animate();
    glfwSwapBuffers(_height);
    glfwPollEvents();
  }
  glfwTerminate();
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
    GLFWwindow* window;
    int width, height;

    if( !glfwInit() )
    {
        fprintf( stderr, "Failed to initialize GLFW\n" );
        exit( EXIT_FAILURE );
    }

    glfwWindowHint(GLFW_DEPTH_BITS, 16);

    window = glfwCreateWindow( 300, 300, "Gears", NULL, NULL );
    if (!window)
    {
        fprintf( stderr, "Failed to open GLFW window\n" );
        glfwTerminate();
        exit( EXIT_FAILURE );
    }

    // Set callback functions
    glfwSetFramebufferSizeCallback(window, reshape);
    glfwSetKeyCallback(window, key);

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval( 1 );

    glfwGetFramebufferSize(window, &width, &height);
    reshape(window, width, height);

    // Parse command-line options
    init();

    // Main loop
    while( !glfwWindowShouldClose(window) )
    {
        // Draw gears
        draw();

        // Update animation
        animate();

        // Swap buffers
        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    // Terminate GLFW
    glfwTerminate();

    // Exit program
    exit( EXIT_SUCCESS );
}